

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImFont::AddGlyph(ImFont *this,ImFontConfig *cfg,ImWchar codepoint,float x0,float y0,float x1,
                float y1,float u0,float v0,float u1,float v1,float advance_x)

{
  int iVar1;
  int iVar2;
  ImFontGlyph *pIVar3;
  ImFontAtlas *pIVar4;
  ImFontGlyph *__dest;
  uint uVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  
  if (cfg != (ImFontConfig *)0x0) {
    fVar7 = cfg->GlyphMaxAdvanceX;
    if (advance_x <= cfg->GlyphMaxAdvanceX) {
      fVar7 = advance_x;
    }
    uVar6 = -(uint)(advance_x < cfg->GlyphMinAdvanceX);
    fVar7 = (float)(uVar6 & (uint)cfg->GlyphMinAdvanceX | ~uVar6 & (uint)fVar7);
    if ((fVar7 != advance_x) || (NAN(fVar7) || NAN(advance_x))) {
      fVar8 = (fVar7 - advance_x) * 0.5;
      if (cfg->PixelSnapH != false) {
        fVar8 = (float)(int)fVar8;
      }
      x0 = x0 + fVar8;
      x1 = x1 + fVar8;
    }
    if (cfg->PixelSnapH != false) {
      fVar7 = (float)(int)(fVar7 + 0.5);
    }
    advance_x = fVar7 + (cfg->GlyphExtraSpacing).x;
  }
  iVar1 = (this->Glyphs).Size;
  iVar2 = (this->Glyphs).Capacity;
  uVar6 = iVar1 + 1;
  if (iVar2 <= iVar1) {
    if (iVar2 == 0) {
      uVar5 = 8;
    }
    else {
      uVar5 = iVar2 / 2 + iVar2;
    }
    if ((int)uVar5 <= (int)uVar6) {
      uVar5 = uVar6;
    }
    if (iVar2 < (int)uVar5) {
      __dest = (ImFontGlyph *)ImGui::MemAlloc((long)(int)uVar5 * 0x28);
      pIVar3 = (this->Glyphs).Data;
      if (pIVar3 != (ImFontGlyph *)0x0) {
        memcpy(__dest,pIVar3,(long)(this->Glyphs).Size * 0x28);
        ImGui::MemFree((this->Glyphs).Data);
      }
      (this->Glyphs).Data = __dest;
      (this->Glyphs).Capacity = uVar5;
    }
  }
  (this->Glyphs).Size = uVar6;
  if (iVar1 < 0) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.h"
                  ,0x662,"T &ImVector<ImFontGlyph>::back() [T = ImFontGlyph]");
  }
  pIVar3 = (this->Glyphs).Data;
  *(uint *)(pIVar3 + ((ulong)uVar6 - 1)) =
       (uint)(y0 != y1 && x0 != x1) * -0x80000000 | (uint)codepoint;
  pIVar3[(ulong)uVar6 - 1].X0 = x0;
  pIVar3[(ulong)uVar6 - 1].Y0 = y0;
  pIVar3[(ulong)uVar6 - 1].X1 = x1;
  pIVar3[(ulong)uVar6 - 1].Y1 = y1;
  pIVar3[(ulong)uVar6 - 1].U0 = u0;
  pIVar3[(ulong)uVar6 - 1].V0 = v0;
  pIVar3[(ulong)uVar6 - 1].U1 = u1;
  pIVar3[(ulong)uVar6 - 1].V1 = v1;
  pIVar3[(ulong)uVar6 - 1].AdvanceX = advance_x;
  pIVar4 = this->ContainerAtlas;
  fVar7 = (float)pIVar4->TexGlyphPadding + 0.99;
  this->DirtyLookupTables = true;
  this->MetricsTotalSurface =
       this->MetricsTotalSurface +
       (int)((float)pIVar4->TexHeight * (v1 - v0) + fVar7) *
       (int)((float)pIVar4->TexWidth * (u1 - u0) + fVar7);
  return;
}

Assistant:

void ImFont::AddGlyph(const ImFontConfig* cfg, ImWchar codepoint, float x0, float y0, float x1, float y1, float u0, float v0, float u1, float v1, float advance_x)
{
    if (cfg != NULL)
    {
        // Clamp & recenter if needed
        const float advance_x_original = advance_x;
        advance_x = ImClamp(advance_x, cfg->GlyphMinAdvanceX, cfg->GlyphMaxAdvanceX);
        if (advance_x != advance_x_original)
        {
            float char_off_x = cfg->PixelSnapH ? ImFloor((advance_x - advance_x_original) * 0.5f) : (advance_x - advance_x_original) * 0.5f;
            x0 += char_off_x;
            x1 += char_off_x;
        }

        // Snap to pixel
        if (cfg->PixelSnapH)
            advance_x = IM_ROUND(advance_x);

        // Bake spacing
        advance_x += cfg->GlyphExtraSpacing.x;
    }

    Glyphs.resize(Glyphs.Size + 1);
    ImFontGlyph& glyph = Glyphs.back();
    glyph.Codepoint = (unsigned int)codepoint;
    glyph.Visible = (x0 != x1) && (y0 != y1);
    glyph.X0 = x0;
    glyph.Y0 = y0;
    glyph.X1 = x1;
    glyph.Y1 = y1;
    glyph.U0 = u0;
    glyph.V0 = v0;
    glyph.U1 = u1;
    glyph.V1 = v1;
    glyph.AdvanceX = advance_x;

    // Compute rough surface usage metrics (+1 to account for average padding, +0.99 to round)
    // We use (U1-U0)*TexWidth instead of X1-X0 to account for oversampling.
    float pad = ContainerAtlas->TexGlyphPadding + 0.99f;
    DirtyLookupTables = true;
    MetricsTotalSurface += (int)((glyph.U1 - glyph.U0) * ContainerAtlas->TexWidth + pad) * (int)((glyph.V1 - glyph.V0) * ContainerAtlas->TexHeight + pad);
}